

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O1

ZyanStatus
ZydisFormatterIntelPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZydisBranchType ZVar2;
  ZyanUSize ZVar3;
  ulong uVar4;
  void *pvVar5;
  ZyanStatus ZVar6;
  ZydisShortString *pZVar7;
  ZydisLetterCase letter_case;
  ZyanUSize ZVar8;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10d,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10e,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10f,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  pZVar7 = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
  if (pZVar7 == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar6 = ZydisStringAppendShortCase
                        (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
      if ((int)ZVar6 < 0) {
        return ZVar6;
      }
    }
    else {
      ZVar3 = (buffer->string).vector.size;
      if (0xfe < ZVar3 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      uVar4 = buffer->capacity;
      ZVar6 = 0x80100009;
      if (ZVar3 + 10 < uVar4) {
        pvVar5 = (buffer->string).vector.data;
        *(char *)((long)pvVar5 + -1) = (char)ZVar3;
        *(undefined8 *)((long)pvVar5 + ZVar3) = 0x696c61766e690006;
        *(undefined2 *)((long)pvVar5 + ZVar3 + 8) = 100;
        ZVar8 = buffer->capacity - (ZVar3 + 2);
        buffer->capacity = ZVar8;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar3 + 2);
        (buffer->string).vector.size = 8;
        if (0xfe < ZVar8) {
          ZVar8 = 0xff;
        }
        (buffer->string).vector.capacity = ZVar8;
        ZVar6 = 0x100000;
      }
      if (uVar4 <= ZVar3 + 10) {
        return ZVar6;
      }
    }
    return 0x100000;
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar6 = ZydisFormatterBufferAppend(buffer,'\x06'), (int)ZVar6 < 0)) {
    return ZVar6;
  }
  ZVar6 = ZydisStringAppendShortCase(&buffer->string,pZVar7,formatter->case_mnemonic);
  if ((int)ZVar6 < 0) {
    return ZVar6;
  }
  ZVar2 = (context->instruction->meta).branch_type;
  if (ZVar2 == ZYDIS_BRANCH_TYPE_FAR) {
    letter_case = formatter->case_mnemonic;
    pZVar7 = &STR_FAR;
  }
  else {
    if (formatter->print_branch_size == '\0') {
      return 0x100000;
    }
    if (ZVar2 == ZYDIS_BRANCH_TYPE_NONE) {
      return 0x100000;
    }
    if (ZVar2 == ZYDIS_BRANCH_TYPE_NEAR) {
      letter_case = formatter->case_mnemonic;
      pZVar7 = &STR_NEAR;
    }
    else {
      if (ZVar2 != ZYDIS_BRANCH_TYPE_SHORT) {
        return 0x80100004;
      }
      letter_case = formatter->case_mnemonic;
      pZVar7 = &STR_SHORT;
    }
  }
  ZVar6 = ZydisStringAppendShortCase(&buffer->string,pZVar7,letter_case);
  return ZVar6;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        return ZydisStringAppendShortCase(&buffer->string, &STR_FAR, formatter->case_mnemonic);
    }
    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}